

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nick.cpp
# Opt level: O0

void __thiscall Enterprise::Nick::output_character<1,8>(Nick *this,uint16_t *target,int columns)

{
  byte bVar1;
  byte bVar2;
  uint16_t *puVar3;
  uint16_t *palette;
  int local_20;
  uint8_t pixels;
  uint8_t character;
  int c;
  int columns_local;
  uint16_t *target_local;
  Nick *this_local;
  
  _c = target;
  for (local_20 = 0; local_20 < columns; local_20 = local_20 + 1) {
    bVar1 = this->ram_[(int)((uint)this->line_data_pointer_[0] + local_20 & 0xffff)];
    bVar2 = this->ram_[(int)((uint)this->line_data_pointer_[1] * 0x100 + (uint)bVar1 & 0xffff)];
    this->last_read_ = bVar2;
    puVar3 = this->alt_ind_palettes[(int)(uint)bVar1 >> 6];
    *_c = puVar3[(int)(bVar2 & 0x80) >> 7];
    _c[1] = puVar3[(int)(bVar2 & 0x40) >> 6];
    _c[2] = puVar3[(int)(bVar2 & 0x20) >> 5];
    _c[3] = puVar3[(int)(bVar2 & 0x10) >> 4];
    _c[4] = puVar3[(int)(bVar2 & 8) >> 3];
    _c[5] = puVar3[(int)(bVar2 & 4) >> 2];
    _c[6] = puVar3[(int)(bVar2 & 2) >> 1];
    _c[7] = puVar3[(int)(bVar2 & 1)];
    _c = _c + 8;
  }
  return;
}

Assistant:

void Nick::output_character(uint16_t *target, int columns) const {
	static_assert(bpp == 1 || bpp == 2 || bpp == 4 || bpp == 8);

	for(int c = 0; c < columns; c++) {
		const uint8_t character = ram_[(line_data_pointer_[0] + c) & 0xffff];
		const uint8_t pixels = ram_[(
			(line_data_pointer_[1] << index_bits) +
			(character & ((1 << index_bits) - 1))
		) & 0xffff];
		last_read_ = pixels;

		switch(bpp) {
			default:
				assert(false);
			break;

			case 1: {
				// This applies ALTIND0 and ALTIND1.
				const uint16_t *palette = alt_ind_palettes[character >> 6];
				output1bpp(pixels);
			} break;

			case 2:		output2bpp(pixels);		break;
			case 4:		output4bpp(pixels);		break;
			case 8:		output8bpp(pixels);		break;
		}
	}
}